

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O0

void __thiscall dbwrapper_tests::dbwrapper::test_method(dbwrapper *this)

{
  undefined1 uVar1;
  bool bVar2;
  const_iterator pbVar3;
  long in_FS_OFFSET;
  bool obfuscate;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<bool> *__range1;
  uint8_t key;
  uint256 res;
  uint256 in;
  CDBWrapper dbw;
  path ph;
  CDBWrapper *in_stack_fffffffffffffbb8;
  ArgsManager *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  path *in_stack_fffffffffffffbd0;
  undefined7 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe7;
  lazy_ostream *in_stack_fffffffffffffbe8;
  CDBWrapper *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  CDBWrapper *in_stack_fffffffffffffc00;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  CDBWrapper *this_00;
  undefined7 in_stack_fffffffffffffc38;
  const_iterator local_370;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  const_string local_308 [2];
  DBParams *in_stack_fffffffffffffd18;
  CDBWrapper *in_stack_fffffffffffffd20;
  assertion_result local_2c8;
  const_string local_290 [2];
  lazy_ostream local_270 [2];
  assertion_result local_250 [2];
  const_string local_218 [2];
  lazy_ostream local_1f8 [2];
  assertion_result local_1d8 [2];
  undefined1 local_199;
  undefined1 *local_198;
  undefined8 local_190;
  undefined1 local_182;
  undefined1 local_181;
  Elf64_Ehdr *local_d8;
  undefined1 local_d0;
  undefined1 local_cf;
  byte local_ce;
  undefined1 local_cd;
  size_t local_8;
  
  local_8 = *(size_t *)(in_FS_OFFSET + 0x28);
  local_182 = 0;
  local_181 = 1;
  local_198 = &local_182;
  local_190 = 2;
  local_370 = std::initializer_list<bool>::begin
                        ((initializer_list<bool> *)in_stack_fffffffffffffbb8);
  pbVar3 = std::initializer_list<bool>::end((initializer_list<bool> *)in_stack_fffffffffffffbc8);
  for (; local_370 != pbVar3; local_370 = local_370 + 1) {
    bVar2 = *local_370;
    ArgsManager::GetDataDirBase(in_stack_fffffffffffffbc0);
    fs::operator/(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    fs::path::~path((path *)in_stack_fffffffffffffbb8);
    fs::path::path((path *)in_stack_fffffffffffffbb8,(path *)0x5a2c5c);
    local_d8 = &std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                basic_string;
    local_d0 = 1;
    local_cf = 0;
    local_cd = 0;
    local_ce = bVar2 & 1;
    CDBWrapper::CDBWrapper(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    DBParams::~DBParams((DBParams *)in_stack_fffffffffffffbb8);
    local_199 = 0x6b;
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffbe8);
    uint256::uint256((uint256 *)in_stack_fffffffffffffbb8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbc8,
                 (pointer)in_stack_fffffffffffffbc0,(unsigned_long)in_stack_fffffffffffffbb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (const_string *)in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8,
                 (const_string *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
      dbwrapper_private::GetObfuscateKey(in_stack_fffffffffffffbb8);
      is_null_key((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbc8
                 );
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffbc8,
                 SUB81((ulong)in_stack_fffffffffffffbc0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbc8,
                 (pointer)in_stack_fffffffffffffbc0,(unsigned_long)in_stack_fffffffffffffbb8);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffbc0,
                 (basic_cstring<const_char> *)in_stack_fffffffffffffbb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbc8,
                 (pointer)in_stack_fffffffffffffbc0,(unsigned_long)in_stack_fffffffffffffbb8);
      in_stack_fffffffffffffbb8 = (CDBWrapper *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1d8,local_1f8,local_218,0x28,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffbb8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffbb8);
      uVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)uVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbc8,
                 (pointer)in_stack_fffffffffffffbc0,(unsigned_long)in_stack_fffffffffffffbb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (const_string *)in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8,
                 (const_string *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
      CDBWrapper::Write<unsigned_char,uint256>
                (in_stack_fffffffffffffc00,
                 (uchar *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (uint256 *)in_stack_fffffffffffffbf0,
                 SUB81((ulong)in_stack_fffffffffffffbe8 >> 0x38,0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffbc8,
                 SUB81((ulong)in_stack_fffffffffffffbc0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbc8,
                 (pointer)in_stack_fffffffffffffbc0,(unsigned_long)in_stack_fffffffffffffbb8);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffbc0,
                 (basic_cstring<const_char> *)in_stack_fffffffffffffbb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbc8,
                 (pointer)in_stack_fffffffffffffbc0,(unsigned_long)in_stack_fffffffffffffbb8);
      in_stack_fffffffffffffbb8 = (CDBWrapper *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_250,local_270,local_290,0x2a,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffbb8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffbb8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbc8,
                 (pointer)in_stack_fffffffffffffbc0,(unsigned_long)in_stack_fffffffffffffbb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (const_string *)in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8,
                 (const_string *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
      in_stack_fffffffffffffc0f =
           CDBWrapper::Read<unsigned_char,uint256>
                     (this_00,(uchar *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08)
                      ,(uint256 *)in_stack_fffffffffffffc00);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffbc8,
                 SUB81((ulong)in_stack_fffffffffffffbc0 >> 0x38,0));
      in_stack_fffffffffffffc00 = (CDBWrapper *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbc8,
                 (pointer)in_stack_fffffffffffffbc0,(unsigned_long)in_stack_fffffffffffffbb8);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffbc0,
                 (basic_cstring<const_char> *)in_stack_fffffffffffffbb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbc8,
                 (pointer)in_stack_fffffffffffffbc0,(unsigned_long)in_stack_fffffffffffffbb8);
      in_stack_fffffffffffffbb8 = (CDBWrapper *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_2c8,(lazy_ostream *)&stack0xfffffffffffffd18,local_308,0x2b,CHECK,CHECK_PRED
                );
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffbb8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffbb8);
      in_stack_fffffffffffffbff = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffbff);
    do {
      in_stack_fffffffffffffbf0 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbc8,
                 (pointer)in_stack_fffffffffffffbc0,(unsigned_long)in_stack_fffffffffffffbb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbb8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (const_string *)in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8,
                 (const_string *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
      in_stack_fffffffffffffbe8 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffbc0,(char (*) [1])in_stack_fffffffffffffbb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffbc8,
                 (pointer)in_stack_fffffffffffffbc0,(unsigned_long)in_stack_fffffffffffffbb8);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffbc0);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffbc0);
      in_stack_fffffffffffffbc8 = "in.ToString()";
      in_stack_fffffffffffffbc0 = (ArgsManager *)&stack0xfffffffffffffe80;
      in_stack_fffffffffffffbb8 = (CDBWrapper *)0x1bdccf1;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                (local_348,local_358,0x2c,1,2);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbb8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbb8);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffffbb8);
      in_stack_fffffffffffffbe7 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffbe7);
    CDBWrapper::~CDBWrapper((CDBWrapper *)CONCAT17(uVar1,in_stack_fffffffffffffc38));
    fs::path::~path((path *)in_stack_fffffffffffffbb8);
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(dbwrapper)
{
    // Perform tests both obfuscated and non-obfuscated.
    for (const bool obfuscate : {false, true}) {
        fs::path ph = m_args.GetDataDirBase() / (obfuscate ? "dbwrapper_obfuscate_true" : "dbwrapper_obfuscate_false");
        CDBWrapper dbw({.path = ph, .cache_bytes = 1 << 20, .memory_only = true, .wipe_data = false, .obfuscate = obfuscate});
        uint8_t key{'k'};
        uint256 in = m_rng.rand256();
        uint256 res;

        // Ensure that we're doing real obfuscation when obfuscate=true
        BOOST_CHECK(obfuscate != is_null_key(dbwrapper_private::GetObfuscateKey(dbw)));

        BOOST_CHECK(dbw.Write(key, in));
        BOOST_CHECK(dbw.Read(key, res));
        BOOST_CHECK_EQUAL(res.ToString(), in.ToString());
    }
}